

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::ClearField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  undefined8 uVar1;
  FieldDescriptor FVar2;
  OneofDescriptor *oneof_descriptor;
  string *default_value;
  bool bVar3;
  uint32 uVar4;
  Type TVar5;
  MapFieldBase *this_01;
  EnumValueDescriptor *pEVar6;
  ulong uVar7;
  Arena *arena;
  long *plVar8;
  undefined4 uVar9;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar4 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    ExtensionSet::ClearExtension
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
               *(int *)(field + 0x38));
    return;
  }
  if (*(int *)(field + 0x4c) == 3) {
    TVar5 = FieldDescriptor::type(field);
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4)) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = 0;
      return;
    case 9:
      uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedPtrFieldBase::
      Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4));
      return;
    case 10:
      goto switchD_003142a5_caseD_a;
    default:
      return;
    }
  }
  oneof_descriptor = *(OneofDescriptor **)(field + 0x60);
  if (oneof_descriptor != (OneofDescriptor *)0x0) {
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x40)) >>
                                   4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x38)) {
      return;
    }
    ClearOneof(this,message,oneof_descriptor);
    return;
  }
  bVar3 = HasBit(this,message,field);
  if (!bVar3) {
    return;
  }
  ClearBit(this,message,field);
  TVar5 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4)) {
  case 1:
  case 3:
    uVar9 = *(undefined4 *)(field + 0xa0);
    goto LAB_0031445e;
  case 2:
  case 4:
    uVar1 = *(undefined8 *)(field + 0xa0);
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = uVar1;
    break;
  case 5:
    uVar1 = *(undefined8 *)(field + 0xa0);
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = uVar1;
    break;
  case 6:
    uVar9 = *(undefined4 *)(field + 0xa0);
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = uVar9;
    break;
  case 7:
    FVar2 = field[0xa0];
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(FieldDescriptor *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) =
         FVar2;
    break;
  case 8:
    pEVar6 = FieldDescriptor::default_value_enum(field);
    uVar9 = *(undefined4 *)(pEVar6 + 0x10);
LAB_0031445e:
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = uVar9;
    break;
  case 9:
    if (field[0x50] == (FieldDescriptor)0x0) {
      plVar8 = (long *)(*(long *)(field + 0x58) + 0x30);
    }
    else if (*(long *)(field + 0x68) == 0) {
      plVar8 = (long *)(*(long *)(field + 0x30) + 0x98);
    }
    else {
      plVar8 = (long *)(*(long *)(field + 0x68) + 0x80);
    }
    default_value =
         *(string **)
          ((long)&(((this->schema_).default_instance_)->super_MessageLite)._vptr_MessageLite +
          (ulong)(this->schema_).offsets_[(int)((ulong)((long)field - *plVar8) >> 3) * 0x3cf3cf3d]);
    uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    arena = *(Arena **)
             ((long)&(message->super_MessageLite)._vptr_MessageLite +
             (ulong)(uint)(this->schema_).metadata_offset_);
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 8);
    }
    ArenaStringPtr::SetAllocated
              ((ArenaStringPtr *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),default_value,
               (string *)0x0,arena);
    return;
  case 10:
    this_00 = &this->schema_;
    if ((this->schema_).has_bits_offset_ != -1) {
      uVar4 = ReflectionSchema::GetFieldOffset(this_00,field);
      (**(code **)(**(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4)
                  + 0x38))();
      return;
    }
    uVar7 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar7 & 1) != 0) {
      uVar7 = *(ulong *)((uVar7 & 0xfffffffffffffffe) + 8);
    }
    if (uVar7 == 0) {
      uVar4 = ReflectionSchema::GetFieldOffset(this_00,field);
      plVar8 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
      if (plVar8 != (long *)0x0) {
        (**(code **)(*plVar8 + 8))();
      }
    }
    uVar4 = ReflectionSchema::GetFieldOffset(this_00,field);
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = 0;
  }
  return;
switchD_003142a5_caseD_a:
  bVar3 = FieldDescriptor::is_map(field);
  uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_01 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
  if (bVar3) {
    this_01 = (MapFieldBase *)MapFieldBase::MutableRepeatedField(this_01);
  }
  RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            ((RepeatedPtrFieldBase *)this_01);
  return;
}

Assistant:

void GeneratedMessageReflection::ClearField(
    Message* message, const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (field->containing_oneof()) {
      ClearOneofField(message, field);
      return;
    }
    if (HasBit(*message, field)) {
      ClearBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                            \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          *MutableRaw<TYPE>(message, field) =                                \
            field->default_value_##TYPE();                                   \
          break;

        CLEAR_TYPE(INT32 , int32 );
        CLEAR_TYPE(INT64 , int64 );
        CLEAR_TYPE(UINT32, uint32);
        CLEAR_TYPE(UINT64, uint64);
        CLEAR_TYPE(FLOAT , float );
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL  , bool  );
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
            field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              const string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableRaw<ArenaStringPtr>(message, field)->SetAllocated(
                  default_ptr, NULL, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (!schema_.HasHasbits()) {
            // Proto3 does not have has-bits and we need to set a message field
            // to NULL in order to indicate its un-presence.
            if (GetArena(message) == NULL) {
              delete *MutableRaw<Message*>(message, field);
            }
            *MutableRaw<Message*>(message, field) = NULL;
          } else {
            (*MutableRaw<Message*>(message, field))->Clear();
          }
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear();       \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->Clear<GenericTypeHandler<Message> >();
        } else {
          // We don't know which subclass of RepeatedPtrFieldBase the type is,
          // so we use RepeatedPtrFieldBase directly.
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->Clear<GenericTypeHandler<Message> >();
        }
        break;
      }
    }
  }
}